

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditersol.c
# Opt level: O0

int main(int argc,char **argv)

{
  char cVar1;
  FILE *fp_00;
  undefined8 uVar2;
  double *rhs;
  double *sol;
  double dVar3;
  double dVar4;
  doublereal dVar5;
  doublereal dVar6;
  doublereal dVar7;
  double local_da0;
  int local_d94;
  int local_d54;
  int local_d50;
  int i_5;
  int i_4;
  int i_3;
  double t;
  double res;
  double nrmB;
  double nrmA;
  double maxferr;
  int nnz32;
  int i_1;
  char msg_9 [256];
  double resid;
  int local_c08;
  int iter;
  int maxit;
  int restrt;
  int i_2;
  int i;
  char msg_8 [256];
  char msg_7 [256];
  char msg_6 [256];
  char msg_5 [256];
  char msg_4 [256];
  char msg_3 [256];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  double *b;
  double *x;
  FILE *fp;
  SuperLUStat_t stat;
  superlu_options_t options;
  mem_usage_t mem_usage;
  double zero;
  double rcond;
  double rpg;
  double *C;
  double *R;
  double *work;
  double *xact;
  double *rhsx;
  double *rhsb;
  int_t local_1c8;
  int_t lwork;
  int_t nnz;
  int_t info;
  int n;
  int m;
  int ldx;
  int nrhs;
  int *perm_r;
  int *perm_c;
  int *etree;
  int_t *xa;
  int_t *asub;
  double *a;
  GlobalLU_t Glu;
  SCformat *Lstore;
  NCformat *Ustore;
  NCformat *Astore;
  SuperMatrix X;
  SuperMatrix B;
  SuperMatrix U;
  SuperMatrix L;
  SuperMatrix A;
  trans_t trans;
  char equed [1];
  char **argv_local;
  int argc_local;
  
  fp_00 = _stdin;
  A.Store._7_1_ = 'B';
  R = (double *)0x0;
  rhsb._4_4_ = 0;
  m = 1;
  A.Store._0_4_ = NOTRANS;
  ilu_set_default_options((superlu_options_t *)&stat.expansions);
  options.DiagPivotThresh._4_4_ = 1;
  options.SymmetricMode = YES;
  if ((0 < rhsb._4_4_) && (R = (double *)superlu_malloc((long)rhsb._4_4_), R == (double *)0x0)) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","Malloc fails for work[].",0xbc,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
           );
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  if (argc < 2) {
    printf("Usage:\n%s [OPTION] < [INPUT] > [OUTPUT]\nOPTION:\n-h -hb:\n\t[INPUT] is a Harwell-Boeing format matrix.\n-r -rb:\n\t[INPUT] is a Rutherford-Boeing format matrix.\n-t -triplet:\n\t[INPUT] is a triplet format matrix.\n"
           ,*argv);
    return 1;
  }
  cVar1 = argv[1][1];
  if (cVar1 == 'H') {
LAB_00101689:
    printf("Input a Harwell-Boeing format matrix:\n");
    dreadhb(fp_00,&info,&nnz,&local_1c8,(double **)&asub,&xa,&etree);
  }
  else {
    if (cVar1 == 'R') {
LAB_001016d6:
      printf("Input a Rutherford-Boeing format matrix:\n");
      dreadrb(&info,&nnz,&local_1c8,(double **)&asub,&xa,&etree);
      goto LAB_0010176e;
    }
    if (cVar1 != 'T') {
      if (cVar1 == 'h') goto LAB_00101689;
      if (cVar1 == 'r') goto LAB_001016d6;
      if (cVar1 != 't') {
        printf("Unrecognized format.\n");
        return 1;
      }
    }
    printf("Input a triplet format matrix:\n");
    dreadtriple(&info,&nnz,&local_1c8,(double **)&asub,&xa,&etree);
  }
LAB_0010176e:
  dCreate_CompCol_Matrix
            ((SuperMatrix *)&L.Store,info,nnz,local_1c8,(double *)asub,xa,etree,SLU_NC,SLU_D,SLU_GE)
  ;
  uVar2 = A._16_8_;
  dfill_diag(nnz,(NCformat *)A._16_8_);
  printf("Dimension %dx%d; # nonzeros %d\n",(ulong)A.Dtype,(ulong)A.Mtype,(ulong)*(uint *)uVar2);
  fflush(_stdout);
  rhsx = doubleMalloc((long)(info * m));
  if (rhsx == (double *)0x0) {
    sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","Malloc fails for rhsb[].",0xea,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
           );
    superlu_abort_and_exit(msg_2 + 0xf8);
  }
  xact = doubleMalloc((long)(info * m));
  if (xact == (double *)0x0) {
    sprintf(msg_3 + 0xf8,"%s at line %d in file %s\n","Malloc fails for rhsx[].",0xeb,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
           );
    superlu_abort_and_exit(msg_3 + 0xf8);
  }
  dCreate_Dense_Matrix((SuperMatrix *)&X.Store,info,m,rhsx,info,SLU_DN,SLU_D,SLU_GE);
  dCreate_Dense_Matrix((SuperMatrix *)&Astore,info,m,xact,info,SLU_DN,SLU_D,SLU_GE);
  work = doubleMalloc((long)(nnz * m));
  n = nnz;
  dGenXtrue(nnz,m,work,nnz);
  dFillRHS((trans_t)A.Store,m,work,n,(SuperMatrix *)&L.Store,(SuperMatrix *)&X.Store);
  perm_c = int32Malloc(nnz);
  if (perm_c == (int *)0x0) {
    sprintf(msg_4 + 0xf8,"%s at line %d in file %s\n","Malloc fails for etree[].",0xf3,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
           );
    superlu_abort_and_exit(msg_4 + 0xf8);
  }
  _ldx = int32Malloc(info);
  if (_ldx == (int *)0x0) {
    sprintf(msg_5 + 0xf8,"%s at line %d in file %s\n","Malloc fails for perm_r[].",0xf4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
           );
    superlu_abort_and_exit(msg_5 + 0xf8);
  }
  perm_r = int32Malloc(nnz);
  if (perm_r == (int *)0x0) {
    sprintf(msg_6 + 0xf8,"%s at line %d in file %s\n","Malloc fails for perm_c[].",0xf5,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
           );
    superlu_abort_and_exit(msg_6 + 0xf8);
  }
  C = (double *)superlu_malloc((long)(int)A.Dtype << 3);
  if (C == (double *)0x0) {
    sprintf(msg_7 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for R[].",0xf7,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
           );
    superlu_abort_and_exit(msg_7 + 0xf8);
  }
  rpg = (double)superlu_malloc((long)(int)A.Mtype << 3);
  if ((void *)rpg == (void *)0x0) {
    sprintf(msg_8 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for C[].",0xf9,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
           );
    superlu_abort_and_exit(msg_8 + 0xf8);
  }
  lwork = 0;
  StatInit((SuperLUStat_t *)&fp);
  B.Mtype = SLU_GE;
  dgsisx((superlu_options_t *)&stat.expansions,(SuperMatrix *)&L.Store,perm_r,_ldx,perm_c,
         (char *)((long)&A.Store + 7),C,(double *)rpg,(SuperMatrix *)&U.Store,
         (SuperMatrix *)&B.Store,R,rhsb._4_4_,(SuperMatrix *)&X.Store,(SuperMatrix *)&Astore,&rcond,
         &zero,(GlobalLU_t *)&a,(mem_usage_t *)&options.lookahead_etree,(SuperLUStat_t *)&fp,&lwork)
  ;
  rhs = doubleMalloc((long)info);
  if (rhs == (double *)0x0) {
    sprintf((char *)&i_2,"%s at line %d in file %s\n","Malloc fails for b[].",0x10b,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
           );
    superlu_abort_and_exit((char *)&i_2);
  }
  if ((A.Store._7_1_ == 'R') || (A.Store._7_1_ == 'B')) {
    for (restrt = 0; restrt < nnz; restrt = restrt + 1) {
      rhs[restrt] = rhsx[restrt] * C[restrt];
    }
  }
  else {
    for (maxit = 0; maxit < info; maxit = maxit + 1) {
      rhs[maxit] = rhsx[maxit];
    }
  }
  printf("dgsisx(): info %lld, equed %c\n",(long)lwork,(ulong)(uint)(int)A.Store._7_1_);
  if (((0 < lwork) || (zero < 1e-08)) || (100000000.0 < rcond)) {
    printf("WARNING: This preconditioner might be unstable.\n");
  }
  if ((lwork == 0) || (lwork == nnz + 1)) {
    if (options.DiagPivotThresh._4_4_ == 1) {
      printf("Recip. pivot growth = %e\n",rcond);
    }
    if (options.SymmetricMode == YES) {
      printf("Recip. condition number = %e\n",zero);
    }
  }
  else if ((0 < lwork) && (rhsb._4_4_ == -1)) {
    printf("** Estimated memory: %lld bytes\n",(long)lwork - (long)nnz);
  }
  Glu.stack.array = (void *)L._16_8_;
  printf("n(A) = %d, nnz(A) = %lld\n",(ulong)(uint)nnz,(long)*(int *)uVar2);
  printf("No of nonzeros in factor L = %lld\n",(long)*Glu.stack.array);
  printf("No of nonzeros in factor U = %lld\n",(long)*(int *)U._16_8_);
  printf("No of nonzeros in L+U = %lld\n",
         ((long)*Glu.stack.array + (long)*(int *)U._16_8_) - (long)nnz);
  printf("Fill ratio: nnz(F)/nnz(A) = %.1f\n",
         (((double)*Glu.stack.array + (double)*(int *)U._16_8_) - (double)nnz) /
         (double)*(int *)uVar2);
  printf("L\\U MB %.3f\ttotal MB needed %.3f\n",(double)(float)options.lookahead_etree / 1000000.0,
         (double)(float)options.SymPattern / 1000000.0);
  fflush(_stdout);
  GLOBAL_A = (SuperMatrix *)&L.Store;
  GLOBAL_L = (SuperMatrix *)&U.Store;
  GLOBAL_U = (SuperMatrix *)&B.Store;
  GLOBAL_STAT = (SuperLUStat_t *)&fp;
  GLOBAL_PERM_C = perm_r;
  GLOBAL_PERM_R = _ldx;
  GLOBAL_OPTIONS = (superlu_options_t *)&stat.expansions;
  GLOBAL_R = C;
  GLOBAL_C = (double *)rpg;
  GLOBAL_MEM_USAGE = (mem_usage_t *)&options.lookahead_etree;
  stat.expansions = 3;
  options.DiagPivotThresh._4_4_ = 0;
  options.SymmetricMode = NO;
  if (nnz / 3 + 1 < 0x32) {
    local_d94 = nnz / 3 + 1;
  }
  else {
    local_d94 = 0x32;
  }
  iter = local_d94;
  local_c08 = 1000;
  resid._4_4_ = 1000;
  msg_9[0xf8] = ':';
  msg_9[0xf9] = -0x74;
  msg_9[0xfa] = '0';
  msg_9[0xfb] = -0x1e;
  msg_9[0xfc] = -0x72;
  msg_9[0xfd] = 'y';
  msg_9[0xfe] = 'E';
  msg_9[0xff] = '>';
  sol = doubleMalloc((long)nnz);
  if (sol == (double *)0x0) {
    sprintf((char *)&nnz32,"%s at line %d in file %s\n","Malloc fails for x[].",0x142,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/EXAMPLE/ditersol.c"
           );
    superlu_abort_and_exit((char *)&nnz32);
  }
  if (lwork <= nnz + 1) {
    maxferr._4_4_ = 1;
    nrmA = 0.0;
    for (i_5 = 0; i_5 < nnz; i_5 = i_5 + 1) {
      sol[i_5] = 0.0;
    }
    dVar3 = SuperLU_timer_();
    dfgmr(nnz,dmatvec_mult,dpsolve,rhs,sol,(double)msg_9._248_8_,iter,(int *)((long)&resid + 4),
          (FILE *)_stdout);
    dVar4 = SuperLU_timer_();
    maxferr._0_4_ = *(undefined4 *)uVar2;
    dVar5 = dnrm2_((integer *)&maxferr,*(doublereal **)(A._16_8_ + 8),
                   (integer *)((long)&maxferr + 4));
    dVar6 = dnrm2_(&info,rhs,(integer *)((long)&maxferr + 4));
    sp_dgemv("N",-1.0,(SuperMatrix *)&L.Store,sol,1,1.0,rhs,1);
    dVar7 = dnrm2_(&info,rhs,(integer *)((long)&maxferr + 4));
    msg_9._248_8_ = dVar7 / dVar6;
    printf("||A||_F = %.1e, ||B||_2 = %.1e, ||B-A*X||_2 = %.1e, relres = %.1e\n",dVar5,dVar6,
           SUB84(dVar7,0),msg_9._248_8_);
    if (local_c08 <= (int)resid._4_4_) {
      if ((double)msg_9._248_8_ < 1.0) {
        if (1e-08 < (double)msg_9._248_8_) {
          resid._4_4_ = 0xffffff91;
        }
      }
      else {
        resid._4_4_ = 0xffffff4c;
      }
    }
    printf("iteration: %d\nresidual: %.1e\nGMRES time: %.2f seconds.\n",msg_9._248_8_,dVar4 - dVar3,
           (ulong)resid._4_4_);
    if ((A.Store._7_1_ == 'C') || (A.Store._7_1_ == 'B')) {
      for (local_d50 = 0; local_d50 < nnz; local_d50 = local_d50 + 1) {
        sol[local_d50] = *(double *)((long)rpg + (long)local_d50 * 8) * sol[local_d50];
      }
    }
    for (local_d54 = 0; local_d54 < info; local_d54 = local_d54 + 1) {
      if (nrmA <= ABS(sol[local_d54] - work[local_d54])) {
        local_da0 = ABS(sol[local_d54] - work[local_d54]);
      }
      else {
        local_da0 = nrmA;
      }
      nrmA = local_da0;
    }
    printf("||X-X_true||_oo = %.1e\n",nrmA);
  }
  fflush(_stdout);
  if (options.SolveInitialized != NO) {
    StatPrint((SuperLUStat_t *)&fp);
  }
  StatFree((SuperLUStat_t *)&fp);
  superlu_free(rhsx);
  superlu_free(xact);
  superlu_free(work);
  superlu_free(perm_c);
  superlu_free(_ldx);
  superlu_free(perm_r);
  superlu_free(C);
  superlu_free((void *)rpg);
  Destroy_CompCol_Matrix((SuperMatrix *)&L.Store);
  Destroy_SuperMatrix_Store((SuperMatrix *)&X.Store);
  Destroy_SuperMatrix_Store((SuperMatrix *)&Astore);
  if (-1 < rhsb._4_4_) {
    Destroy_SuperNode_Matrix((SuperMatrix *)&U.Store);
    Destroy_CompCol_Matrix((SuperMatrix *)&B.Store);
  }
  superlu_free(rhs);
  superlu_free(sol);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    void dmatvec_mult(double alpha, double x[], double beta, double y[]);
    void dpsolve(int n, double x[], double y[]);
    extern int dfgmr( int n,
	void (*matvec_mult)(double, double [], double, double []),
	void (*psolve)(int n, double [], double[]),
	double *rhs, double *sol, double tol, int restrt, int *itmax,
	FILE *fits);
    extern int dfill_diag(int n, NCformat *Astore);

    char     equed[1] = {'B'};
    trans_t  trans;
    SuperMatrix A, L, U;
    SuperMatrix B, X;
    NCformat *Astore;
    NCformat *Ustore;
    SCformat *Lstore;
    GlobalLU_t	   Glu; /* facilitate multiple factorizations with 
                           SamePattern_SameRowPerm                  */
    double   *a;
    int_t    *asub, *xa;
    int      *etree;
    int      *perm_c; /* column permutation vector */
    int      *perm_r; /* row permutations from partial pivoting */
    int      nrhs, ldx, m, n;
    int_t    info, nnz, lwork;
    double   *rhsb, *rhsx, *xact;
    double   *work = NULL;
    double   *R, *C;
    double   rpg, rcond;
    double zero = 0.0;
    mem_usage_t   mem_usage;
    superlu_options_t options;
    SuperLUStat_t stat;
    FILE 	  *fp = stdin;

    double *x, *b;

#ifdef DEBUG
    extern int num_drop_L, num_drop_U;
#endif

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter main()");
#endif

    /* Defaults */
    lwork = 0;
    nrhs  = 1;
    trans = NOTRANS;

    /* Set the default input options:
	options.Fact = DOFACT;
	options.Equil = YES;
	options.ColPerm = COLAMD;
	options.DiagPivotThresh = 0.1; //different from complete LU
	options.Trans = NOTRANS;
	options.IterRefine = NOREFINE;
	options.SymmetricMode = NO;
	options.PivotGrowth = NO;
	options.ConditionNumber = NO;
	options.PrintStat = YES;
	options.RowPerm = LargeDiag_MC64;
	options.ILU_DropTol = 1e-4;
	options.ILU_FillTol = 1e-2;
	options.ILU_FillFactor = 10.0;
	options.ILU_DropRule = DROP_BASIC | DROP_AREA;
	options.ILU_Norm = INF_NORM;
	options.ILU_MILU = SILU;
     */
    ilu_set_default_options(&options);

    /* Modify the defaults. */
    options.PivotGrowth = YES;	  /* Compute reciprocal pivot growth */
    options.ConditionNumber = YES;/* Compute reciprocal condition number */

    if ( lwork > 0 ) {
	work = SUPERLU_MALLOC(lwork);
	if ( !work ) ABORT("Malloc fails for work[].");
    }

    /* Read matrix A from a file in Harwell-Boeing format.*/
    if (argc < 2)
    {
	printf("Usage:\n%s [OPTION] < [INPUT] > [OUTPUT]\nOPTION:\n"
		"-h -hb:\n\t[INPUT] is a Harwell-Boeing format matrix.\n"
		"-r -rb:\n\t[INPUT] is a Rutherford-Boeing format matrix.\n"
		"-t -triplet:\n\t[INPUT] is a triplet format matrix.\n",
		argv[0]);
        return EXIT_FAILURE;
    }
    else
    {
	switch (argv[1][1])
	{
	    case 'H':
	    case 'h':
		printf("Input a Harwell-Boeing format matrix:\n");
		dreadhb(fp, &m, &n, &nnz, &a, &asub, &xa);
		break;
	    case 'R':
	    case 'r':
		printf("Input a Rutherford-Boeing format matrix:\n");
		dreadrb(&m, &n, &nnz, &a, &asub, &xa);
		break;
	    case 'T':
	    case 't':
		printf("Input a triplet format matrix:\n");
		dreadtriple(&m, &n, &nnz, &a, &asub, &xa);
		break;
	    default:
		printf("Unrecognized format.\n");
		return EXIT_FAILURE;
	}
    }

    dCreate_CompCol_Matrix(&A, m, n, nnz, a, asub, xa,
                                SLU_NC, SLU_D, SLU_GE);
    Astore = A.Store;
    dfill_diag(n, Astore);
    printf("Dimension %dx%d; # nonzeros %d\n", (int)A.nrow, (int)A.ncol, (int)Astore->nnz);
    fflush(stdout);

    /* Generate the right-hand side */
    if ( !(rhsb = doubleMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsb[].");
    if ( !(rhsx = doubleMalloc(m * nrhs)) ) ABORT("Malloc fails for rhsx[].");
    dCreate_Dense_Matrix(&B, m, nrhs, rhsb, m, SLU_DN, SLU_D, SLU_GE);
    dCreate_Dense_Matrix(&X, m, nrhs, rhsx, m, SLU_DN, SLU_D, SLU_GE);
    xact = doubleMalloc(n * nrhs);
    ldx = n;
    dGenXtrue(n, nrhs, xact, ldx);
    dFillRHS(trans, nrhs, xact, ldx, &A, &B);

    if ( !(etree = int32Malloc(n)) ) ABORT("Malloc fails for etree[].");
    if ( !(perm_r = int32Malloc(m)) ) ABORT("Malloc fails for perm_r[].");
    if ( !(perm_c = int32Malloc(n)) ) ABORT("Malloc fails for perm_c[].");
    if ( !(R = (double *) SUPERLU_MALLOC(A.nrow * sizeof(double))) )
	ABORT("SUPERLU_MALLOC fails for R[].");
    if ( !(C = (double *) SUPERLU_MALLOC(A.ncol * sizeof(double))) )
	ABORT("SUPERLU_MALLOC fails for C[].");

    info = 0;
#ifdef DEBUG
    num_drop_L = 0;
    num_drop_U = 0;
#endif

    /* Initialize the statistics variables. */
    StatInit(&stat);

    /* Compute the incomplete factorization and compute the condition number
       and pivot growth using dgsisx. */
    B.ncol = 0;  /* not to perform triangular solution */
    dgsisx(&options, &A, perm_c, perm_r, etree, equed, R, C, &L, &U, work,
	   lwork, &B, &X, &rpg, &rcond, &Glu, &mem_usage, &stat, &info);

    /* Set RHS for GMRES. */
    if (!(b = doubleMalloc(m))) ABORT("Malloc fails for b[].");
    if (*equed == 'R' || *equed == 'B') {
	for (int i = 0; i < n; ++i) b[i] = rhsb[i] * R[i];
    } else {
	for (int i = 0; i < m; i++) b[i] = rhsb[i];
    }

    printf("dgsisx(): info %lld, equed %c\n", (long long)info, equed[0]);
    if (info > 0 || rcond < 1e-8 || rpg > 1e8)
	printf("WARNING: This preconditioner might be unstable.\n");

    if ( info == 0 || info == n+1 ) {
	if ( options.PivotGrowth == YES )
	    printf("Recip. pivot growth = %e\n", rpg);
	if ( options.ConditionNumber == YES )
	    printf("Recip. condition number = %e\n", rcond);
    } else if ( info > 0 && lwork == -1 ) {
	printf("** Estimated memory: %lld bytes\n", (long long)info - n);
    }

    Lstore = (SCformat *) L.Store;
    Ustore = (NCformat *) U.Store;
    printf("n(A) = %d, nnz(A) = %lld\n", n, (long long) Astore->nnz);
    printf("No of nonzeros in factor L = %lld\n", (long long) Lstore->nnz);
    printf("No of nonzeros in factor U = %lld\n", (long long) Ustore->nnz);
    printf("No of nonzeros in L+U = %lld\n", (long long) Lstore->nnz + Ustore->nnz - n);
    printf("Fill ratio: nnz(F)/nnz(A) = %.1f\n",
	    ((double)(Lstore->nnz) + (double)(Ustore->nnz) - (double)n)
	    / (double)Astore->nnz);
    printf("L\\U MB %.3f\ttotal MB needed %.3f\n",
	   mem_usage.for_lu/1e6, mem_usage.total_needed/1e6);
    fflush(stdout);

    /* Set the global variables. */
    GLOBAL_A = &A;
    GLOBAL_L = &L;
    GLOBAL_U = &U;
    GLOBAL_STAT = &stat;
    GLOBAL_PERM_C = perm_c;
    GLOBAL_PERM_R = perm_r;
    GLOBAL_OPTIONS = &options;
    GLOBAL_R = R;
    GLOBAL_C = C;
    GLOBAL_MEM_USAGE = &mem_usage;

    /* Set the options to do solve-only. */
    options.Fact = FACTORED;
    options.PivotGrowth = NO;
    options.ConditionNumber = NO;

    /* Set the variables used by GMRES. */
    int restrt = SUPERLU_MIN(n / 3 + 1, 50);
    int maxit = 1000;
    int iter = maxit;
    double resid = 1e-8;
    if (!(x = doubleMalloc(n))) ABORT("Malloc fails for x[].");

    if (info <= n + 1)
    {
	int i_1 = 1, nnz32;
	double maxferr = 0.0, nrmA, nrmB, res, t;
	extern double dnrm2_(int *, double [], int *);
	extern void daxpy_(int *, double *, double [], int *, double [], int *);

	/* Initial guess */
	for (int i = 0; i < n; i++) x[i] = zero;

	t = SuperLU_timer_();

	/* Call GMRES */
	dfgmr(n, dmatvec_mult, dpsolve, b, x, resid, restrt, &iter, stdout);

	t = SuperLU_timer_() - t;

	/* Output the result. */
	nnz32 = Astore->nnz;
	nrmA = dnrm2_(&nnz32, (double *)((NCformat *)A.Store)->nzval,
		&i_1);
	nrmB = dnrm2_(&m, b, &i_1);
	sp_dgemv("N", -1.0, &A, x, 1, 1.0, b, 1);
	res = dnrm2_(&m, b, &i_1);
	resid = res / nrmB;
	printf("||A||_F = %.1e, ||B||_2 = %.1e, ||B-A*X||_2 = %.1e, "
		"relres = %.1e\n", nrmA, nrmB, res, resid);

	if (iter >= maxit)
	{
	    if (resid >= 1.0) iter = -180;
	    else if (resid > 1e-8) iter = -111;
	}
	printf("iteration: %d\nresidual: %.1e\nGMRES time: %.2f seconds.\n",
		iter, resid, t);

	/* Scale the solution back if equilibration was performed. */
	if (*equed == 'C' || *equed == 'B') 
	    for (int i = 0; i < n; i++) x[i] *= C[i];

	for (int i = 0; i < m; i++) {
	    maxferr = SUPERLU_MAX(maxferr, fabs(x[i] - xact[i]));
        }
	printf("||X-X_true||_oo = %.1e\n", maxferr);
    }
#ifdef DEBUG
    printf("%d entries in L and %d entries in U dropped.\n",
	    num_drop_L, num_drop_U);
#endif
    fflush(stdout);

    if ( options.PrintStat ) StatPrint(&stat);
    StatFree(&stat);

    SUPERLU_FREE (rhsb);
    SUPERLU_FREE (rhsx);
    SUPERLU_FREE (xact);
    SUPERLU_FREE (etree);
    SUPERLU_FREE (perm_r);
    SUPERLU_FREE (perm_c);
    SUPERLU_FREE (R);
    SUPERLU_FREE (C);
    Destroy_CompCol_Matrix(&A);
    Destroy_SuperMatrix_Store(&B);
    Destroy_SuperMatrix_Store(&X);
    if ( lwork >= 0 ) {
	Destroy_SuperNode_Matrix(&L);
	Destroy_CompCol_Matrix(&U);
    }
    SUPERLU_FREE(b);
    SUPERLU_FREE(x);

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit main()");
#endif

    return EXIT_SUCCESS;
}